

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BinTree.h
# Opt level: O0

void __thiscall
axl::sl::
BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
::erase(BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
        *this,Iterator it)

{
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *node1;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  in_RSI;
  BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
  *in_RDI;
  RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
  *unaff_retaddr;
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *next;
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *node;
  RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *in_stack_ffffffffffffffc8;
  OwningListBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>_>_>
  *in_stack_ffffffffffffffd8;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  in_stack_ffffffffffffffe0;
  BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
  *this_00;
  
  this_00 = in_RDI;
  node1 = IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
          ::operator*((IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                       *)&stack0xfffffffffffffff8);
  if (((node1->
       super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
       ).m_left != (RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *)0x0) &&
     ((node1->
      super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
      ).m_right != (RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*> *)0x0)) {
    in_stack_ffffffffffffffe0.m_p =
         (Entry *)(node1->
                  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                  ).super_MapEntry<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>.
                  super_ListLink.m_next;
    xcg(this_00,node1,in_stack_ffffffffffffffe0.m_p);
  }
  RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
  ::onErase(unaff_retaddr,in_RSI.m_p);
  Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  ::Iterator((Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
              *)in_RDI,in_stack_ffffffffffffffc8);
  OwningListBase<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>_>_>
  ::erase(in_stack_ffffffffffffffd8,
          (Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
           )in_stack_ffffffffffffffe0.m_p);
  return;
}

Assistant:

void
	erase(Iterator it) {
		Node* node = *it;

		if (node->m_left && node->m_right) {
			Node* next = (Node*)node->m_next;
			ASSERT(next == getLeftmostChild(node->m_right));
			xcg(node, next);
		}

		static_cast<T*>(this)->onErase(node);
		m_nodeList.erase(node);
	}